

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperMatch.c
# Opt level: O2

int Map_MatchCompare(Map_Man_t *pMan,Map_Match_t *pM1,Map_Match_t *pM2,int fDoingArea)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  
  fVar12 = pMan->fEpsilon;
  if (fDoingArea == 0) {
    fVar1 = (pM1->tArrive).Worst;
    fVar2 = (pM2->tArrive).Worst;
    if (fVar2 - fVar12 <= fVar1) {
      bVar10 = true;
      if (fVar2 + fVar12 < fVar1) goto LAB_00365f38;
      if (pM2->AreaFlow - fVar12 <= pM1->AreaFlow) {
        if (fVar12 + pM2->AreaFlow < pM1->AreaFlow) goto LAB_00365f38;
        goto LAB_00365f77;
      }
    }
  }
  else if (pM2->AreaFlow - fVar12 <= pM1->AreaFlow) {
    bVar10 = true;
    if (pM2->AreaFlow + fVar12 < pM1->AreaFlow) goto LAB_00365f38;
    if ((pMan->fUseProfile != 0) && (pM1->pSuperBest != (Map_Super_t *)0x0)) {
      iVar5 = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
      iVar6 = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
      iVar7 = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
      iVar8 = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
      if ((iVar7 < iVar5) && (iVar6 < iVar8)) goto LAB_00365f36;
      if ((iVar8 < iVar6) && (iVar5 < iVar7)) goto LAB_00365f38;
      fVar12 = pMan->fEpsilon;
    }
    fVar1 = (pM1->tArrive).Worst;
    fVar2 = (pM2->tArrive).Worst;
    if (fVar2 - fVar12 <= fVar1) {
      if (fVar2 + fVar12 < fVar1) goto LAB_00365f38;
LAB_00365f77:
      bVar10 = true;
      uVar3 = *(uint *)&pM1->pSuperBest->field_0x4;
      uVar9 = uVar3 >> 8 & 0xf;
      uVar4 = *(uint *)&pM2->pSuperBest->field_0x4;
      uVar11 = uVar4 >> 8 & 0xf;
      if (uVar11 > uVar9 || uVar9 == uVar11) {
        if (uVar11 <= uVar9) {
          bVar10 = (uVar4 >> 2 & 7) < (uVar3 >> 2 & 7);
        }
        goto LAB_00365f38;
      }
    }
  }
LAB_00365f36:
  bVar10 = false;
LAB_00365f38:
  return (int)bVar10;
}

Assistant:

int Map_MatchCompare( Map_Man_t * pMan, Map_Match_t * pM1, Map_Match_t * pM2, int fDoingArea )
{
//    if ( pM1->pSuperBest == pM2->pSuperBest )
//        return 0;
    if ( !fDoingArea )
    {
        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
    else
    {
        // compare the areas or area flows
        if ( pM1->AreaFlow < pM2->AreaFlow - pMan->fEpsilon )
            return 0;
        if ( pM1->AreaFlow > pM2->AreaFlow + pMan->fEpsilon )
            return 1;

        // make decision based on cell profile
        if ( pMan->fUseProfile && pM1->pSuperBest && pM1->pSuperBest )
        {
            int M1req = Mio_GateReadProfile(pM1->pSuperBest->pRoot);
            int M2req = Mio_GateReadProfile(pM2->pSuperBest->pRoot);
            int M1act = Mio_GateReadProfile2(pM1->pSuperBest->pRoot);
            int M2act = Mio_GateReadProfile2(pM2->pSuperBest->pRoot);
            //printf( "%d %d  ", M1req, M2req );
            if ( M1act < M1req && M2act > M2req )
                return 0;
            if ( M2act < M2req && M1act > M1req )
                return 1;
        }

        // compare the arrival times
        if ( pM1->tArrive.Worst < pM2->tArrive.Worst - pMan->fEpsilon )
            return 0;
        if ( pM1->tArrive.Worst > pM2->tArrive.Worst + pMan->fEpsilon )
            return 1;
        // compare the fanout limits
        if ( pM1->pSuperBest->nFanLimit > pM2->pSuperBest->nFanLimit )
            return 0;
        if ( pM1->pSuperBest->nFanLimit < pM2->pSuperBest->nFanLimit )
            return 1;
        // compare the number of leaves
        if ( pM1->pSuperBest->nFanins < pM2->pSuperBest->nFanins )
            return 0;
        if ( pM1->pSuperBest->nFanins > pM2->pSuperBest->nFanins )
            return 1;
        // otherwise prefer the old cut
        return 0;
    }
}